

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

ON_CurvePiping * __thiscall ON_CurvePiping::operator=(ON_CurvePiping *this,ON_CurvePiping *cp)

{
  bool b;
  int iVar1;
  CapTypes ct;
  double d;
  
  if (this != cp) {
    d = Radius(cp);
    SetRadius(this,d);
    iVar1 = Segments(cp);
    SetSegments(this,iVar1);
    b = Faceted(cp);
    SetFaceted(this,b);
    iVar1 = Accuracy(cp);
    SetAccuracy(this,iVar1);
    ct = CapType(cp);
    SetCapType(this,ct);
  }
  return this;
}

Assistant:

const ON_CurvePiping& ON_CurvePiping::operator = (const ON_CurvePiping& cp)
{
  if (this != &cp)
  {
    SetRadius  (cp.Radius());
    SetSegments(cp.Segments());
    SetFaceted (cp.Faceted());
    SetAccuracy(cp.Accuracy());
    SetCapType (cp.CapType());
  }

  return *this;
}